

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::SearchPrefix(cmFindPackageCommand *this,string *prefix_in)

{
  undefined8 uVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  size_type sVar5;
  ulong uVar6;
  bool bVar7;
  string_view sVar8;
  static_string_view sVar9;
  undefined1 local_208 [8];
  cmAppendPathSegmentGenerator cmakeGen;
  cmEnumPathSegmentsGenerator cmnGen;
  string_view local_1d0;
  string_view local_1c0;
  string_view local_1b0;
  string_view local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string libArch;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  common;
  cmProjectDirectoryListGenerator secondPkgDirGen;
  cmProjectDirectoryListGenerator firstPkgDirGen;
  undefined1 local_a0 [8];
  cmCaseInsensitiveDirectoryListGenerator iCMakeGen;
  anon_class_8_1_8991fb9c searchFn;
  string prefix;
  undefined1 local_40 [8];
  string prefixWithoutSlash;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  prefixWithoutSlash.field_2._8_8_ = prefix_in;
  uVar2 = std::__cxx11::string::empty();
  bVar7 = false;
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::back();
    bVar7 = *pcVar3 == '/';
  }
  if (bVar7) {
    bVar7 = cmsys::SystemTools::FileIsDirectory((string *)prefixWithoutSlash.field_2._8_8_);
    if (bVar7) {
      std::__cxx11::string::string((string *)local_40,(string *)prefixWithoutSlash.field_2._8_8_);
      bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"/");
      if ((bVar7) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == '/')) {
        lVar4 = std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)local_40,lVar4 - 1);
      }
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->IgnoredPaths,(key_type *)local_40);
      if ((sVar5 == 0) &&
         (sVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->IgnoredPrefixPaths,(key_type *)local_40), sVar5 == 0)) {
        bVar7 = SearchDirectory(this,(string *)prefixWithoutSlash.field_2._8_8_);
        uVar1 = prefixWithoutSlash.field_2._8_8_;
        if (bVar7) {
          this_local._7_1_ = true;
        }
        else {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&searchFn,uVar1);
          iCMakeGen._32_8_ = this;
          sVar8 = (string_view)::cm::operator____s("cmake",5);
          anon_unknown.dwarf_ad0985::cmCaseInsensitiveDirectoryListGenerator::
          cmCaseInsensitiveDirectoryListGenerator
                    ((cmCaseInsensitiveDirectoryListGenerator *)local_a0,sVar8);
          anon_unknown.dwarf_ad0985::cmProjectDirectoryListGenerator::
          cmProjectDirectoryListGenerator
                    ((cmProjectDirectoryListGenerator *)&secondPkgDirGen.SortOrder,&this->Names,
                     this->SortOrder,this->SortDirection);
          bVar7 = (anonymous_namespace)::
                  TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                            ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                             (cmCaseInsensitiveDirectoryListGenerator *)local_a0);
          if (bVar7) {
            this_local._7_1_ = true;
          }
          else {
            bVar7 = (anonymous_namespace)::
                    TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                              ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                               (cmProjectDirectoryListGenerator *)&secondPkgDirGen.SortOrder);
            if (bVar7) {
              this_local._7_1_ = true;
            }
            else {
              bVar7 = (anonymous_namespace)::
                      TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                                ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                                 (cmProjectDirectoryListGenerator *)&secondPkgDirGen.SortOrder,
                                 (cmCaseInsensitiveDirectoryListGenerator *)local_a0);
              if (bVar7) {
                this_local._7_1_ = true;
              }
              else {
                anon_unknown.dwarf_ad0985::cmProjectDirectoryListGenerator::
                cmProjectDirectoryListGenerator
                          ((cmProjectDirectoryListGenerator *)
                           &common.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->Names,
                           this->SortOrder,this->SortDirection);
                bVar7 = (anonymous_namespace)::
                        TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                                  ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                                   (cmProjectDirectoryListGenerator *)&secondPkgDirGen.SortOrder,
                                   (cmCaseInsensitiveDirectoryListGenerator *)local_a0,
                                   (cmProjectDirectoryListGenerator *)
                                   &common.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (bVar7) {
                  this_local._7_1_ = true;
                }
                else {
                  std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)((long)&libArch.field_2 + 8));
                  std::__cxx11::string::string((string *)local_170);
                  uVar6 = std::__cxx11::string::empty();
                  if ((uVar6 & 1) == 0) {
                    std::operator+(&local_190,"lib/",&this->LibraryArchitecture);
                    std::__cxx11::string::operator=((string *)local_170,(string *)&local_190);
                    std::__cxx11::string::~string((string *)&local_190);
                    std::
                    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    ::emplace_back<std::__cxx11::string&>
                              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                                *)(libArch.field_2._M_local_buf + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_170);
                  }
                  if ((this->UseLib32Paths & 1U) != 0) {
                    local_1a0 = (string_view)::cm::operator____s("lib32",5);
                    std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::emplace_back<cm::static_string_view>
                              ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)((long)&libArch.field_2 + 8),(static_string_view *)&local_1a0);
                  }
                  if ((this->UseLib64Paths & 1U) != 0) {
                    local_1b0 = (string_view)::cm::operator____s("lib64",5);
                    std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::emplace_back<cm::static_string_view>
                              ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)((long)&libArch.field_2 + 8),(static_string_view *)&local_1b0);
                  }
                  if ((this->UseLibx32Paths & 1U) != 0) {
                    local_1c0 = (string_view)::cm::operator____s("libx32",6);
                    std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::emplace_back<cm::static_string_view>
                              ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)((long)&libArch.field_2 + 8),(static_string_view *)&local_1c0);
                  }
                  local_1d0 = (string_view)::cm::operator____s("lib",3);
                  std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::emplace_back<cm::static_string_view>
                            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)((long)&libArch.field_2 + 8),(static_string_view *)&local_1d0);
                  sVar9 = ::cm::operator____s("share",5);
                  cmnGen.Current._M_current =
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       sVar9.super_string_view._M_len;
                  std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::emplace_back<cm::static_string_view>
                            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)((long)&libArch.field_2 + 8),(static_string_view *)&cmnGen.Current);
                  anon_unknown.dwarf_ad0985::cmEnumPathSegmentsGenerator::
                  cmEnumPathSegmentsGenerator
                            ((cmEnumPathSegmentsGenerator *)&cmakeGen.NeedReset,
                             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)((long)&libArch.field_2 + 8));
                  sVar8 = (string_view)::cm::operator____s("cmake",5);
                  anon_unknown.dwarf_ad0985::cmAppendPathSegmentGenerator::
                  cmAppendPathSegmentGenerator((cmAppendPathSegmentGenerator *)local_208,sVar8);
                  bVar7 = (anonymous_namespace)::
                          TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                                    ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,
                                     (string *)&searchFn,
                                     (cmEnumPathSegmentsGenerator *)&cmakeGen.NeedReset,
                                     (cmAppendPathSegmentGenerator *)local_208,
                                     (cmProjectDirectoryListGenerator *)&secondPkgDirGen.SortOrder);
                  if (bVar7) {
                    this_local._7_1_ = true;
                  }
                  else {
                    bVar7 = (anonymous_namespace)::
                            TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                                      ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,
                                       (string *)&searchFn,
                                       (cmEnumPathSegmentsGenerator *)&cmakeGen.NeedReset,
                                       (cmProjectDirectoryListGenerator *)&secondPkgDirGen.SortOrder
                                      );
                    if (bVar7) {
                      this_local._7_1_ = true;
                    }
                    else {
                      bVar7 = (anonymous_namespace)::
                              TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                                        ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,
                                         (string *)&searchFn,
                                         (cmEnumPathSegmentsGenerator *)&cmakeGen.NeedReset,
                                         (cmProjectDirectoryListGenerator *)
                                         &secondPkgDirGen.SortOrder,
                                         (cmCaseInsensitiveDirectoryListGenerator *)local_a0);
                      if (bVar7) {
                        this_local._7_1_ = true;
                      }
                      else {
                        bVar7 = (anonymous_namespace)::
                                TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                                          ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,
                                           (string *)&searchFn,
                                           (cmProjectDirectoryListGenerator *)
                                           &secondPkgDirGen.SortOrder,
                                           (cmEnumPathSegmentsGenerator *)&cmakeGen.NeedReset,
                                           (cmAppendPathSegmentGenerator *)local_208,
                                           (cmProjectDirectoryListGenerator *)
                                           &common.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        if (bVar7) {
                          this_local._7_1_ = true;
                        }
                        else {
                          bVar7 = (anonymous_namespace)::
                                  TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                                            ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,
                                             (string *)&searchFn,
                                             (cmProjectDirectoryListGenerator *)
                                             &secondPkgDirGen.SortOrder,
                                             (cmEnumPathSegmentsGenerator *)&cmakeGen.NeedReset,
                                             (cmProjectDirectoryListGenerator *)
                                             &common.
                                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          if (bVar7) {
                            this_local._7_1_ = true;
                          }
                          else {
                            this_local._7_1_ =
                                 (anonymous_namespace)::
                                 TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                                           ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,
                                            (string *)&searchFn,
                                            (cmProjectDirectoryListGenerator *)
                                            &secondPkgDirGen.SortOrder,
                                            (cmEnumPathSegmentsGenerator *)&cmakeGen.NeedReset,
                                            (cmProjectDirectoryListGenerator *)
                                            &common.
                                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            (cmCaseInsensitiveDirectoryListGenerator *)local_a0);
                          }
                        }
                      }
                    }
                  }
                  std::__cxx11::string::~string((string *)local_170);
                  std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)((long)&libArch.field_2 + 8));
                }
                anon_unknown.dwarf_ad0985::cmProjectDirectoryListGenerator::
                ~cmProjectDirectoryListGenerator
                          ((cmProjectDirectoryListGenerator *)
                           &common.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
            }
          }
          anon_unknown.dwarf_ad0985::cmProjectDirectoryListGenerator::
          ~cmProjectDirectoryListGenerator
                    ((cmProjectDirectoryListGenerator *)&secondPkgDirGen.SortOrder);
          anon_unknown.dwarf_ad0985::cmCaseInsensitiveDirectoryListGenerator::
          ~cmCaseInsensitiveDirectoryListGenerator
                    ((cmCaseInsensitiveDirectoryListGenerator *)local_a0);
          std::__cxx11::string::~string((string *)&searchFn);
        }
      }
      else {
        this_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("!prefix_in.empty() && prefix_in.back() == \'/\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx"
                ,0x9b6,"bool cmFindPackageCommand::SearchPrefix(const std::string &)");
}

Assistant:

bool cmFindPackageCommand::SearchPrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in.back() == '/');

  // Skip this if the prefix does not exist.
  if (!cmSystemTools::FileIsDirectory(prefix_in)) {
    return false;
  }

  // Skip this if it's in ignored paths.
  std::string prefixWithoutSlash = prefix_in;
  if (prefixWithoutSlash != "/" && prefixWithoutSlash.back() == '/') {
    prefixWithoutSlash.erase(prefixWithoutSlash.length() - 1);
  }
  if (this->IgnoredPaths.count(prefixWithoutSlash) ||
      this->IgnoredPrefixPaths.count(prefixWithoutSlash)) {
    return false;
  }

  // PREFIX/ (useful on windows or in build trees)
  if (this->SearchDirectory(prefix_in)) {
    return true;
  }

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string const prefix = prefix_in.substr(0, prefix_in.size() - 1);

  auto searchFn = [this](const std::string& fullPath) -> bool {
    return this->SearchDirectory(fullPath);
  };

  auto iCMakeGen = cmCaseInsensitiveDirectoryListGenerator{ "cmake"_s };
  auto firstPkgDirGen =
    cmProjectDirectoryListGenerator{ this->Names, this->SortOrder,
                                     this->SortDirection };

  // PREFIX/(cmake|CMake)/ (useful on windows or in build trees)
  if (TryGeneratedPaths(searchFn, prefix, iCMakeGen)) {
    return true;
  }

  // PREFIX/(Foo|foo|FOO).*/
  if (TryGeneratedPaths(searchFn, prefix, firstPkgDirGen)) {
    return true;
  }

  // PREFIX/(Foo|foo|FOO).*/(cmake|CMake)/
  if (TryGeneratedPaths(searchFn, prefix, firstPkgDirGen, iCMakeGen)) {
    return true;
  }

  auto secondPkgDirGen =
    cmProjectDirectoryListGenerator{ this->Names, this->SortOrder,
                                     this->SortDirection };

  // PREFIX/(Foo|foo|FOO).*/(cmake|CMake)/(Foo|foo|FOO).*/
  if (TryGeneratedPaths(searchFn, prefix, firstPkgDirGen, iCMakeGen,
                        secondPkgDirGen)) {
    return true;
  }

  // Construct list of common install locations (lib and share).
  std::vector<cm::string_view> common;
  std::string libArch;
  if (!this->LibraryArchitecture.empty()) {
    libArch = "lib/" + this->LibraryArchitecture;
    common.emplace_back(libArch);
  }
  if (this->UseLib32Paths) {
    common.emplace_back("lib32"_s);
  }
  if (this->UseLib64Paths) {
    common.emplace_back("lib64"_s);
  }
  if (this->UseLibx32Paths) {
    common.emplace_back("libx32"_s);
  }
  common.emplace_back("lib"_s);
  common.emplace_back("share"_s);

  auto cmnGen = cmEnumPathSegmentsGenerator{ common };
  auto cmakeGen = cmAppendPathSegmentGenerator{ "cmake"_s };

  // PREFIX/(lib/ARCH|lib*|share)/cmake/(Foo|foo|FOO).*/
  if (TryGeneratedPaths(searchFn, prefix, cmnGen, cmakeGen, firstPkgDirGen)) {
    return true;
  }

  // PREFIX/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/
  if (TryGeneratedPaths(searchFn, prefix, cmnGen, firstPkgDirGen)) {
    return true;
  }

  // PREFIX/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/(cmake|CMake)/
  if (TryGeneratedPaths(searchFn, prefix, cmnGen, firstPkgDirGen, iCMakeGen)) {
    return true;
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib*|share)/cmake/(Foo|foo|FOO).*/
  if (TryGeneratedPaths(searchFn, prefix, firstPkgDirGen, cmnGen, cmakeGen,
                        secondPkgDirGen)) {
    return true;
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/
  if (TryGeneratedPaths(searchFn, prefix, firstPkgDirGen, cmnGen,
                        secondPkgDirGen)) {
    return true;
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/(cmake|CMake)/
  return TryGeneratedPaths(searchFn, prefix, firstPkgDirGen, cmnGen,
                           secondPkgDirGen, iCMakeGen);
}